

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.cpp
# Opt level: O1

void __thiscall anon_unknown.dwarf_22be5::AppImpl::immediatePanic(AppImpl *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_20;
  
  puts("panic!");
  if ((this->m_preservedStateOnPanic).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    (*((this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_AppState[7])();
    (this->m_preservedStateOnPanic).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_preservedStateOnPanic).
                super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &(this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    MakeState_Panic();
    this_00 = (this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi;
    (this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
    (this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         p_Stack_20;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
    (*((this->m_state).super___shared_ptr<AppState,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      _vptr_AppState[3])();
  }
  return;
}

Assistant:

void immediatePanic()
    {
        puts("panic!");
        if (m_preservedStateOnPanic)
        {
            // error: panicking while we are in panic?
            return;
        }
        m_state->deactivate();
        m_preservedStateOnPanic = m_state;
        m_state = MakeState_Panic();
        m_state->activate();
    }